

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonFieldVariables
          (FieldGeneratorBase *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  uint32 uVar1;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  long *plVar7;
  mapped_type *pmVar8;
  undefined8 *puVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  byte *pbVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar16;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  Descriptor *descriptor;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  _Alloc_hider _Var22;
  ulong uVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  FieldGeneratorBase *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string hasBitsMask;
  uint8 tag_array [5];
  string tag_bytes;
  key_type local_170;
  key_type local_150;
  key_type local_120;
  byte local_fd [5];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_f8;
  FieldDescriptor *local_f0 [2];
  FieldDescriptor local_e0 [16];
  key_type local_d0;
  uint local_ac;
  key_type local_a8;
  uint local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  FieldGeneratorBase *local_60;
  uint local_54;
  key_type local_50;
  
  pFVar16 = this->descriptor_;
  iVar2 = *(int *)(pFVar16 + 0x44);
  local_f8 = variables;
  if (*(once_flag **)(pFVar16 + 0x30) != (once_flag *)0x0) {
    local_150._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_f0[0] = pFVar16;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar16 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_150,
               local_f0);
  }
  uVar18 = iVar2 * 8 + 1;
  iVar2 = 0x1f;
  if (uVar18 != 0) {
    for (; uVar18 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  uVar18 = (iVar2 * 9 + 0x49U >> 6) << (*(int *)(pFVar16 + 0x38) == 10);
  pFVar16 = this->descriptor_;
  if (*(once_flag **)(pFVar16 + 0x30) != (once_flag *)0x0) {
    local_150._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_f0[0] = pFVar16;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar16 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_150,
               local_f0);
  }
  uVar19 = uVar18 >> (*(int *)(pFVar16 + 0x38) == 10);
  pFVar16 = this->descriptor_;
  iVar2 = *(int *)(pFVar16 + 0x44);
  local_54 = uVar18;
  bVar4 = FieldDescriptor::is_packed(pFVar16);
  local_ac = 2;
  if (!bVar4) {
    if (*(once_flag **)(pFVar16 + 0x30) != (once_flag *)0x0) {
      local_150._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_f0[0] = pFVar16;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar16 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_150,
                 local_f0);
    }
    local_ac = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                        (ulong)*(uint *)(pFVar16 + 0x38) * 4);
  }
  local_ac = iVar2 << 3 | local_ac;
  local_fd[0] = (byte)local_ac;
  local_60 = this;
  if (0x7f < local_ac) {
    local_fd[0] = local_fd[0] | 0x80;
    if (local_ac < 0x4000) {
      local_fd[1] = (byte)(local_ac >> 7);
    }
    else {
      pbVar11 = local_fd + 1;
      uVar18 = local_ac >> 7;
      do {
        *pbVar11 = (byte)uVar18 | 0x80;
        uVar5 = uVar18 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar18;
        uVar18 = uVar5;
      } while (bVar4);
      *pbVar11 = (byte)uVar5;
    }
  }
  paVar10 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar10;
  pcVar6 = FastInt32ToBufferLeft((uint)local_fd[0],paVar10->_M_local_buf);
  local_150._M_string_length = (long)pcVar6 - (long)paVar10;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  local_84 = uVar19;
  if (1 < uVar19) {
    uVar20 = 1;
    do {
      paVar10 = &local_150.field_2;
      local_150._M_dataplus._M_p = (pointer)paVar10;
      pcVar6 = FastInt32ToBufferLeft((uint)local_fd[uVar20],paVar10->_M_local_buf);
      local_150._M_string_length = (long)pcVar6 - (long)paVar10;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,local_150._M_dataplus._M_p,
                 local_150._M_dataplus._M_p + local_150._M_string_length);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x3b35ec);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar10) {
        local_170.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_170.field_2._8_8_ = plVar7[3];
      }
      else {
        local_170.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_170._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_170._M_string_length = plVar7[1];
      *plVar7 = (long)paVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_f0,(ulong)local_170._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      uVar20 = uVar20 + 1;
    } while (uVar19 != uVar20);
  }
  paVar10 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar10;
  pcVar6 = FastUInt32ToBufferLeft(local_ac,paVar10->_M_local_buf);
  paVar24 = &local_170.field_2;
  local_150._M_string_length = (long)pcVar6 - (long)paVar10;
  local_170._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"tag","");
  pmVar17 = local_f8;
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_f8,&local_120);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_170);
  this_01 = local_60;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar24) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar10;
  pcVar6 = FastInt32ToBufferLeft(local_54,paVar10->_M_local_buf);
  local_150._M_string_length = (long)pcVar6 - (long)paVar10;
  local_170._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,local_150._M_dataplus._M_p,
             local_150._M_dataplus._M_p + local_150._M_string_length);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"tag_size","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar17,&local_120);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar24) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"tag_bytes","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar17,&local_150);
  std::__cxx11::string::_M_assign((string *)pmVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)this_01->descriptor_;
  if (*(once_flag **)(paVar10->_M_local_buf + 0x30) != (once_flag *)0x0) {
    local_150._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_170._M_dataplus._M_p = (pointer)paVar10;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(paVar10->_M_local_buf + 0x30),
               (_func_void_FieldDescriptor_ptr **)&local_150,(FieldDescriptor **)&local_170);
  }
  pmVar17 = local_f8;
  if (*(int *)(paVar10->_M_local_buf + 0x38) == 10) {
    uVar1 = *(int *)(this_01->descriptor_ + 0x44) * 8 + 4;
    uVar18 = *(int *)(this_01->descriptor_ + 0x44) << 3;
    local_fd[0] = (byte)uVar1;
    if (0x7f < uVar18) {
      local_fd[0] = local_fd[0] | 0x80;
      if (uVar18 < 0x4000) {
        local_fd[1] = (byte)(uVar18 >> 7);
      }
      else {
        pbVar11 = local_fd + 1;
        uVar18 = uVar18 >> 7;
        do {
          *pbVar11 = (byte)uVar18 | 0x80;
          uVar19 = uVar18 >> 7;
          pbVar11 = pbVar11 + 1;
          bVar4 = 0x3fff < uVar18;
          uVar18 = uVar19;
        } while (bVar4);
        *pbVar11 = (byte)uVar19;
      }
    }
    paVar10 = &local_150.field_2;
    local_150._M_dataplus._M_p = (pointer)paVar10;
    pcVar6 = FastInt32ToBufferLeft((uint)local_fd[0],paVar10->_M_local_buf);
    local_150._M_string_length = (long)pcVar6 - (long)paVar10;
    local_170._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    std::__cxx11::string::operator=((string *)local_f0,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar24) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_ac = uVar1;
    if (1 < local_84) {
      uVar20 = (ulong)local_84;
      uVar23 = 1;
      do {
        paVar10 = &local_150.field_2;
        local_150._M_dataplus._M_p = (pointer)paVar10;
        pcVar6 = FastInt32ToBufferLeft((uint)local_fd[uVar23],paVar10->_M_local_buf);
        local_150._M_string_length = (long)pcVar6 - (long)paVar10;
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_120,local_150._M_dataplus._M_p,
                   local_150._M_dataplus._M_p + local_150._M_string_length);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x3b35ec);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar10) {
          local_170.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_170.field_2._8_8_ = puVar9[3];
        }
        else {
          local_170.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_170._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_170._M_string_length = puVar9[1];
        *puVar9 = paVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_f0,(ulong)local_170._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        uVar23 = uVar23 + 1;
      } while (uVar20 != uVar23);
    }
    paVar10 = &local_150.field_2;
    local_150._M_dataplus._M_p = (pointer)paVar10;
    pcVar6 = FastUInt32ToBufferLeft(local_ac,paVar10->_M_local_buf);
    local_150._M_string_length = (long)pcVar6 - (long)paVar10;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"end_tag","");
    this_01 = local_60;
    pmVar17 = local_f8;
    this_00 = &local_60->variables_;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"end_tag_bytes","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_150);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
  }
  paVar24 = &local_170.field_2;
  paVar10 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"access_level","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar17,&local_150);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x3b6135);
  pFVar16 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    operator_delete(local_150._M_dataplus._M_p);
    pFVar16 = extraout_RDX_00;
  }
  GetPropertyName_abi_cxx11_(&local_150,(csharp *)this_01->descriptor_,pFVar16);
  local_170._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"property_name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar17,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar24) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  type_name_abi_cxx11_(&local_150,this_01,this_01->descriptor_);
  local_170._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"type_name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar17,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  descriptor = extraout_RDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar24) {
    operator_delete(local_170._M_dataplus._M_p);
    descriptor = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    operator_delete(local_150._M_dataplus._M_p);
    descriptor = extraout_RDX_03;
  }
  GetClassName_abi_cxx11_(&local_150,*(csharp **)(this_01->descriptor_ + 0x50),descriptor);
  local_170._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"extended_type","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar17,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar24) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  name_abi_cxx11_(&local_150,this_01);
  local_170._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar17,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar24) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"descriptor_name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar17,&local_150);
  std::__cxx11::string::_M_assign((string *)pmVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  default_value_abi_cxx11_(&local_150,this_01,this_01->descriptor_);
  local_170._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"default_value","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar17,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar24) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  capitalized_type_name_abi_cxx11_(&local_150,this_01);
  local_170._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"capitalized_type_name","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar17,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar24) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  number_abi_cxx11_(&local_150,this_01);
  local_170._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"number","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar17,&local_170);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar24) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  bVar4 = has_default_value(this_01);
  if ((bVar4) && (*(int *)(*(long *)(this_01->descriptor_ + 0x28) + 0x3c) != 2)) {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"name","");
    pmVar17 = local_f8;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_120);
    pcVar3 = (pmVar8->_M_dataplus)._M_p;
    local_170._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar3,pcVar3 + pmVar8->_M_string_length);
    std::__cxx11::string::append((char *)&local_170);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"default_value","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_d0);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_170,(ulong)(pmVar8->_M_dataplus)._M_p);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar14) {
      local_150.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_150.field_2._8_4_ = (undefined4)plVar7[3];
      local_150.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_150._M_string_length = plVar7[1];
    *plVar7 = (long)paVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"name_def_message","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_a8);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    pmVar17 = local_f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    this_01 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar24) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    _Var22._M_p = local_120._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
LAB_002a1b56:
      operator_delete(_Var22._M_p);
    }
  }
  else {
    local_170._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"name","");
    pmVar17 = local_f8;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_170);
    pcVar3 = (pmVar8->_M_dataplus)._M_p;
    local_150._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar3,pcVar3 + pmVar8->_M_string_length);
    std::__cxx11::string::append((char *)&local_150);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"name_def_message","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    _Var22._M_p = local_170._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar24) goto LAB_002a1b56;
  }
  if (*(int *)(*(long *)(this_01->descriptor_ + 0x28) + 0x3c) == 2) {
    local_170._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"property_name","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_170);
    std::operator+(&local_150,"Has",pmVar8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar24) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_170._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"property_name","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_170);
    std::operator+(&local_150,"other.Has",pmVar8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"other_has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar24) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_170._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_170);
    std::operator+(&local_150,"!",pmVar8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"has_not_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar24) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_170._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"other_has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_170);
    std::operator+(&local_150,"!",pmVar8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"other_has_not_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_120);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar24) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    iVar2 = this_01->presenceIndex_;
    if (iVar2 == -1) goto LAB_002a230b;
    iVar21 = iVar2 + 0x1f;
    if (-1 < iVar2) {
      iVar21 = iVar2;
    }
    local_150._M_dataplus._M_p = (pointer)paVar10;
    pcVar6 = FastInt32ToBufferLeft(iVar21 >> 5,paVar10->_M_local_buf);
    local_150._M_string_length = (long)pcVar6 - (long)paVar10;
    local_170._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    local_150._M_dataplus._M_p = (pointer)paVar10;
    pcVar6 = FastInt32ToBufferLeft
                       (1 << ((byte)this_01->presenceIndex_ & 0x1f),paVar10->_M_local_buf);
    local_150._M_string_length = (long)pcVar6 - (long)paVar10;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    std::operator+(&local_80,"(_hasBits",&local_170);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
    paVar24 = &local_a8.field_2;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_a8.field_2._M_allocated_capacity = *psVar12;
      local_a8.field_2._8_8_ = plVar7[3];
      local_a8._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar12;
      local_a8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_a8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a8,(ulong)local_120._M_dataplus._M_p);
    paVar14 = &local_d0.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar13) {
      local_d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)paVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar13) {
      local_150.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_150.field_2._8_4_ = (undefined4)plVar7[3];
      local_150.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_150._M_string_length = plVar7[1];
    *plVar7 = (long)paVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"has_field_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_50);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pmVar17 = local_f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar14) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar24) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    paVar13 = &local_80.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar13) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    std::operator+(&local_a8,"_hasBits",&local_170);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar15) {
      local_d0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)paVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)local_120._M_dataplus._M_p);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar15) {
      local_150.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_150.field_2._8_4_ = (undefined4)plVar7[3];
      local_150.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_150._M_string_length = plVar7[1];
    *plVar7 = (long)paVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_80._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"set_has_field","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_80);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar13) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar14) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar24) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    std::operator+(&local_a8,"_hasBits",&local_170);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar15) {
      local_d0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_d0.field_2._8_8_ = puVar9[3];
      local_d0._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_d0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_d0._M_string_length = puVar9[1];
    *puVar9 = paVar15;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_120._M_dataplus._M_p);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar15) {
      local_150.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_150.field_2._8_4_ = *(undefined4 *)(puVar9 + 3);
      local_150.field_2._12_4_ = *(undefined4 *)((long)puVar9 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_150._M_string_length = puVar9[1];
    *puVar9 = paVar15;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_80._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"clear_has_field","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_80);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar13) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar14) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar24) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    _Var22._M_p = local_170._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p == &local_170.field_2) goto LAB_002a230b;
  }
  else {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"property_name","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_120);
    pcVar3 = (pmVar8->_M_dataplus)._M_p;
    local_170._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar3,pcVar3 + pmVar8->_M_string_length);
    std::__cxx11::string::append((char *)&local_170);
    paVar14 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"default_value","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_d0);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_170,(ulong)(pmVar8->_M_dataplus)._M_p);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar13) {
      local_150.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_150.field_2._8_4_ = (undefined4)plVar7[3];
      local_150.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_150._M_string_length = plVar7[1];
    *plVar7 = (long)paVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    paVar13 = &local_a8.field_2;
    local_a8._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_a8);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar13) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar14) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar24) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"property_name","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_d0);
    std::operator+(&local_120,"other.",pmVar8);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar15) {
      local_170.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_170.field_2._8_8_ = puVar9[3];
      local_170._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_170.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_170._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_170._M_string_length = puVar9[1];
    *puVar9 = paVar15;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_a8._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"default_value","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar17,&local_a8);
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_170,(ulong)(pmVar8->_M_dataplus)._M_p);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar15) {
      local_150.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_150.field_2._8_4_ = *(undefined4 *)(puVar9 + 3);
      local_150.field_2._12_4_ = *(undefined4 *)((long)puVar9 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_150.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_150._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_150._M_string_length = puVar9[1];
    *puVar9 = paVar15;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"other_has_property_check","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_f8,&local_80);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar10) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar13) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar24) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    _Var22._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar14) goto LAB_002a230b;
  }
  operator_delete(_Var22._M_p);
LAB_002a230b:
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonFieldVariables(
    std::map<string, string>* variables) {
  // Note: this will be valid even though the tag emitted for packed and unpacked versions of
  // repeated fields varies by wire format. The wire format is encoded in the bottom 3 bits, which
  // never effects the tag size.
  int tag_size = internal::WireFormat::TagSize(descriptor_->number(), descriptor_->type());
  int part_tag_size = tag_size;
  if (descriptor_->type() == FieldDescriptor::TYPE_GROUP) {
    part_tag_size /= 2;
  }
  uint tag = internal::WireFormat::MakeTag(descriptor_);
  uint8 tag_array[5];
  io::CodedOutputStream::WriteTagToArray(tag, tag_array);
  string tag_bytes = StrCat(tag_array[0]);
  for (int i = 1; i < part_tag_size; i++) {
    tag_bytes += ", " + StrCat(tag_array[i]);
  }

  (*variables)["tag"] = StrCat(tag);
  (*variables)["tag_size"] = StrCat(tag_size);
  (*variables)["tag_bytes"] = tag_bytes;

  if (descriptor_->type() == FieldDescriptor::Type::TYPE_GROUP) {
    tag = internal::WireFormatLite::MakeTag(
        descriptor_->number(),
        internal::WireFormatLite::WIRETYPE_END_GROUP);
    io::CodedOutputStream::WriteTagToArray(tag, tag_array);
    tag_bytes = StrCat(tag_array[0]);
    for (int i = 1; i < part_tag_size; i++) {
        tag_bytes += ", " + StrCat(tag_array[i]);
    }

    variables_["end_tag"] = StrCat(tag);
    variables_["end_tag_bytes"] = tag_bytes;
  }

  (*variables)["access_level"] = "public";

  (*variables)["property_name"] = property_name();
  (*variables)["type_name"] = type_name();
  (*variables)["extended_type"] = GetClassName(descriptor_->containing_type());
  (*variables)["name"] = name();
  (*variables)["descriptor_name"] = descriptor_->name();
  (*variables)["default_value"] = default_value();
  (*variables)["capitalized_type_name"] = capitalized_type_name();
  (*variables)["number"] = number();
  if (has_default_value() && !IsProto2(descriptor_->file())) {
    (*variables)["name_def_message"] =
      (*variables)["name"] + "_ = " + (*variables)["default_value"];
  } else {
    (*variables)["name_def_message"] = (*variables)["name"] + "_";
  }
  if (IsProto2(descriptor_->file())) {
    (*variables)["has_property_check"] = "Has" + (*variables)["property_name"];
    (*variables)["other_has_property_check"] = "other.Has" + (*variables)["property_name"];
    (*variables)["has_not_property_check"] = "!" + (*variables)["has_property_check"];
    (*variables)["other_has_not_property_check"] = "!" + (*variables)["other_has_property_check"];
    if (presenceIndex_ != -1) {
      string hasBitsNumber = StrCat(presenceIndex_ / 32);
      string hasBitsMask = StrCat(1 << (presenceIndex_ % 32));
      (*variables)["has_field_check"] = "(_hasBits" + hasBitsNumber + " & " + hasBitsMask + ") != 0";
      (*variables)["set_has_field"] = "_hasBits" + hasBitsNumber + " |= " + hasBitsMask;
      (*variables)["clear_has_field"] = "_hasBits" + hasBitsNumber + " &= ~" + hasBitsMask;
    }
  } else {
    (*variables)["has_property_check"] =
      (*variables)["property_name"] + " != " + (*variables)["default_value"];
    (*variables)["other_has_property_check"] = "other." +
      (*variables)["property_name"] + " != " + (*variables)["default_value"];
  }
}